

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_kernel.h
# Opt level: O3

void __thiscall
dlib::array<unsigned_long,_dlib::memory_manager_stateless_kernel_1<char>_>::set_max_size
          (array<unsigned_long,_dlib::memory_manager_stateless_kernel_1<char>_> *this,size_t max)

{
  unsigned_long *puVar1;
  
  (*(this->super_enumerable<unsigned_long>)._vptr_enumerable[3])();
  this->array_size = 0;
  this->last_pos = (unsigned_long *)0x0;
  if (max == 0) {
    if (this->array_elements != (unsigned_long *)0x0) {
      operator_delete__(this->array_elements);
    }
    this->max_array_size = 0;
    this->array_elements = (unsigned_long *)0x0;
  }
  else if (this->max_array_size != max) {
    if (this->array_elements != (unsigned_long *)0x0) {
      operator_delete__(this->array_elements);
    }
    puVar1 = (unsigned_long *)operator_new__(-(ulong)(max >> 0x3d != 0) | max * 8);
    this->array_elements = puVar1;
    this->max_array_size = max;
  }
  return;
}

Assistant:

void array<T,mem_manager>::
    set_max_size(
        size_t max
    )
    {
        reset();
        array_size = 0;
        last_pos = 0;
        if (max != 0)
        {
            // if new max size is different
            if (max != max_array_size)
            {
                if (array_elements)
                {
                    pool.deallocate_array(array_elements);
                }
                // try to get more memroy
                try { array_elements = pool.allocate_array(max); }
                catch (...) { array_elements = 0;  max_array_size = 0; throw; }
                max_array_size = max;
            }

        }
        // if the array is being made to be zero
        else
        {
            if (array_elements)
                pool.deallocate_array(array_elements);
            max_array_size = 0;
            array_elements = 0;
        }
    }